

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O1

void fl_initialize(int *argc,char **argv,char *param_3,void *param_4,int param_5)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int local_24;
  
  uVar1 = *argc;
  lVar6 = (long)(int)uVar1;
  uVar5 = 0xffffffffffffffff;
  if (-2 < lVar6) {
    uVar5 = lVar6 * 8 + 8;
  }
  initargc = uVar1;
  initargv = (char **)operator_new__(uVar5);
  if (-1 < lVar6) {
    memcpy(initargv,argv,(ulong)uVar1 * 8 + 8);
  }
  local_24 = 1;
  iVar2 = *argc;
  iVar4 = 1;
  if (1 < iVar2) {
    do {
      iVar2 = Fl::arg(iVar2,argv,&local_24);
      if (iVar2 == 0) {
        lVar6 = (long)local_24;
        local_24 = local_24 + 1;
        lVar3 = (long)iVar4;
        iVar4 = iVar4 + 1;
        argv[lVar3] = argv[lVar6];
      }
      iVar2 = *argc;
    } while (local_24 < iVar2);
  }
  argv[iVar4] = (char *)0x0;
  *argc = iVar4;
  if (fl_flip == '\x02') {
    fl_flip = '\0';
  }
  return;
}

Assistant:

void fl_initialize(int *argc, char **argv, const char *, FL_CMD_OPT *, int) {
  initargc = *argc;
  initargv = new char*[*argc+1];
  int i,j;
  for (i=0; i<=*argc; i++) initargv[i] = argv[i];
  for (i=j=1; i<*argc; ) {
    if (Fl::arg(*argc,argv,i));
    else argv[j++] = argv[i++];
  }
  argv[j] = 0;
  *argc = j;
  if (fl_flip==2) fl_flip = 0;
}